

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

string * __thiscall
jbcoin::STObject::getText_abi_cxx11_(string *__return_storage_ptr__,STObject *this)

{
  pointer pSVar1;
  pointer pSVar2;
  string asStack_48 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"{",(allocator *)asStack_48);
  pSVar1 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->v_).
                super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*pSVar2->p_->_vptr_STBase[6])(asStack_48);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(asStack_48);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string STObject::getText () const
{
    std::string ret = "{";
    bool first = false;
    for (auto const& elem : v_)
    {
        if (! first)
        {
            ret += ", ";
            first = false;
        }

        ret += elem->getText ();
    }
    ret += "}";
    return ret;
}